

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsCreateArray(uint length,JsValueRef *result)

{
  anon_class_16_2_2f8e7890 fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *result_local;
  uint length_local;
  
  fn.result = &local_18;
  fn.length = (uint *)((long)&result_local + 4);
  local_18 = result;
  result_local._4_4_ = length;
  JVar1 = ContextAPINoScriptWrapper<JsCreateArray::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreateArray(_In_ unsigned int length, _Out_ JsValueRef *result)
{
    return ContextAPINoScriptWrapper([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateBasicArray, length);

        PARAM_NOT_NULL(result);
        *result = nullptr;

        *result = scriptContext->GetLibrary()->CreateArray(length);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}